

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# akarin_timer.cpp
# Opt level: O1

void AkarinTimer::mark_end(char *p_mark)

{
  _Hash_node_base **pp_Var1;
  int iVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  char *in_RDI;
  __node_base _Var6;
  float fVar7;
  char *local_18;
  
  _Var6._M_nxt = chrono_timer_marks._M_h._M_before_begin._M_nxt;
  local_18 = in_RDI;
  if (chrono_timer_marks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    do {
      iVar2 = strcmp(in_RDI,(char *)_Var6._M_nxt[1]._M_nxt);
      if (iVar2 == 0) {
        fVar7 = get_current_time();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"timer_mark name:",0x10);
        if (local_18 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x9033f8);
        }
        else {
          sVar3 = strlen(local_18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_18,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," time:",6);
        pmVar4 = std::__detail::
                 _Map_base<const_char_*,_std::pair<const_char_*const,_float>,_std::allocator<std::pair<const_char_*const,_float>_>,_std::__detail::_Select1st,_std::equal_to<const_char_*>,_std::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_float>,_std::allocator<std::pair<const_char_*const,_float>_>,_std::__detail::_Select1st,_std::equal_to<const_char_*>,_std::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&chrono_timer_marks,&local_18);
        poVar5 = std::ostream::_M_insert<double>((double)(fVar7 - *pmVar4));
        goto LAB_00315ea0;
      }
      pp_Var1 = &(_Var6._M_nxt)->_M_nxt;
      _Var6._M_nxt = *pp_Var1;
    } while (*pp_Var1 != (_Hash_node_base *)0x0);
  }
  poVar5 = (ostream *)&std::cerr;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "you are attempting to close a marker that have not been registered",0x42);
LAB_00315ea0:
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  return;
}

Assistant:

void AkarinTimer::mark_end(
    const char *p_mark) noexcept
{
    auto find_iter = std::find_if(
        chrono_timer_marks.cbegin(),
        chrono_timer_marks.cend(),
        [p_mark](const std::pair<const char *, float> &p_timer_iter) -> bool {
            return strcmp(p_mark, p_timer_iter.first) == 0;
        });
    if (find_iter == chrono_timer_marks.cend())
    {
        std::cerr << "you are attempting to close a marker that have not been registered"
                  << "\n";
        return;
    }

    const auto &current_time = get_current_time();
    std::cout << "timer_mark name:" << p_mark << " time:" << current_time - chrono_timer_marks[p_mark] << "\n";
}